

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall
glslang::HlslGrammar::acceptConditionalExpression(HlslGrammar *this,TIntermTyped **node)

{
  HlslToken *loc_00;
  int *piVar1;
  bool bVar2;
  TIntermTyped *pTVar3;
  char *syntax;
  TIntermTyped *falseNode;
  TIntermTyped *trueNode;
  TSourceLoc loc;
  
  bVar2 = acceptBinaryExpression(this,node,PlLogicalOr);
  if (bVar2) {
    bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokQuestion);
    if (!bVar2) {
      return true;
    }
    loc_00 = &(this->super_HlslTokenStream).token;
    pTVar3 = HlslParseContext::convertConditionalExpression
                       (this->parseContext,&loc_00->loc,*node,false);
    *node = pTVar3;
    if (pTVar3 == (TIntermTyped *)0x0) {
      return false;
    }
    piVar1 = &(this->parseContext->super_TParseContextBase).controlFlowNestingLevel;
    *piVar1 = *piVar1 + 1;
    trueNode = (TIntermTyped *)0x0;
    bVar2 = acceptExpression(this,&trueNode);
    if (bVar2) {
      loc.column = (this->super_HlslTokenStream).token.loc.column;
      loc._20_4_ = *(undefined4 *)&(this->super_HlslTokenStream).token.loc.field_0x14;
      loc.name = (loc_00->loc).name;
      loc.string = (this->super_HlslTokenStream).token.loc.string;
      loc.line = (this->super_HlslTokenStream).token.loc.line;
      bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokColon);
      if (bVar2) {
        falseNode = (TIntermTyped *)0x0;
        bVar2 = acceptAssignmentExpression(this,&falseNode);
        if (bVar2) {
          piVar1 = &(this->parseContext->super_TParseContextBase).controlFlowNestingLevel;
          *piVar1 = *piVar1 + -1;
          pTVar3 = TIntermediate::addSelection(this->intermediate,*node,trueNode,falseNode,&loc);
          *node = pTVar3;
          return bVar2;
        }
        expected(this,"expression after :");
        return bVar2;
      }
      syntax = ":";
    }
    else {
      syntax = "expression after ?";
    }
    expected(this,syntax);
  }
  return false;
}

Assistant:

bool HlslGrammar::acceptConditionalExpression(TIntermTyped*& node)
{
    // binary_expression
    if (! acceptBinaryExpression(node, PlLogicalOr))
        return false;

    if (! acceptTokenClass(EHTokQuestion))
        return true;

    node = parseContext.convertConditionalExpression(token.loc, node, false);
    if (node == nullptr)
        return false;

    ++parseContext.controlFlowNestingLevel;  // this only needs to work right if no errors

    TIntermTyped* trueNode = nullptr;
    if (! acceptExpression(trueNode)) {
        expected("expression after ?");
        return false;
    }
    TSourceLoc loc = token.loc;

    if (! acceptTokenClass(EHTokColon)) {
        expected(":");
        return false;
    }

    TIntermTyped* falseNode = nullptr;
    if (! acceptAssignmentExpression(falseNode)) {
        expected("expression after :");
        return false;
    }

    --parseContext.controlFlowNestingLevel;

    node = intermediate.addSelection(node, trueNode, falseNode, loc);

    return true;
}